

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase47::run(TestCase47 *this)

{
  Builder builder_00;
  Reader reader;
  Builder builder_01;
  Reader reader_00;
  Schema schema;
  undefined8 in_stack_fffffffffffffda8;
  Reader local_218;
  Reader local_1e0;
  Reader local_1a8;
  RawBrandedSchema *local_178;
  Schema SStack_170;
  SegmentBuilder *local_168;
  CapTableBuilder *pCStack_160;
  void *local_158;
  WirePointer *pWStack_150;
  Schema local_138;
  undefined1 auStack_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase47 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  schema.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  local_138.raw = schema.raw;
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)schema.raw);
  local_158 = root.builder.data;
  pWStack_150 = root.builder.pointers;
  local_168 = root.builder.segment;
  pCStack_160 = root.builder.capTable;
  local_178 = (RawBrandedSchema *)auStack_130;
  SStack_170 = root.schema.super_Schema.raw;
  builder_00.builder.segment = root.builder.segment;
  builder_00.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_00.builder.capTable = root.builder.capTable;
  builder_00.builder.data = root.builder.data;
  builder_00.builder.pointers = root.builder.pointers;
  builder_00.builder.dataSize = (int)in_stack_fffffffffffffda8;
  builder_00.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  builder_00.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffda8 >> 0x30);
  initDynamicTestMessage(builder_00);
  DynamicStruct::Builder::asReader(&local_1e0,(Builder *)auStack_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_1a8,&local_1e0);
  reader._reader.capTable = (CapTableReader *)local_1a8._reader.data;
  reader._reader.segment = (SegmentReader *)local_1a8._reader.capTable;
  reader._reader.data = local_1a8._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1a8._reader._32_8_;
  reader._reader.dataSize = local_1a8._reader.nestingLimit;
  reader._reader.pointerCount = local_1a8._reader._44_2_;
  reader._reader._38_2_ = local_1a8._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffda8;
  checkTestMessage(reader);
  DynamicStruct::Builder::asReader(&local_218,(Builder *)auStack_130);
  reader_00.reader.segment = (SegmentReader *)local_218.reader.capTable;
  reader_00.schema.super_Schema.raw = (Schema)(Schema)local_218.reader.segment;
  reader_00.reader.capTable = (CapTableReader *)local_218.reader.data;
  reader_00.reader.data = local_218.reader.pointers;
  reader_00.reader.pointers = (WirePointer *)local_218.reader._32_8_;
  reader_00.reader.dataSize = local_218.reader.nestingLimit;
  reader_00.reader.pointerCount = local_218.reader._44_2_;
  reader_00.reader._38_2_ = local_218.reader._46_2_;
  reader_00.reader._40_8_ = schema.raw;
  checkDynamicTestMessage(reader_00);
  builder_01.builder.segment = root.builder.segment;
  builder_01.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_01.builder.capTable = root.builder.capTable;
  builder_01.builder.data = root.builder.data;
  builder_01.builder.pointers = root.builder.pointers;
  builder_01.builder.dataSize = local_218.reader.nestingLimit;
  builder_01.builder.pointerCount = local_218.reader._44_2_;
  builder_01.builder._38_2_ = local_218.reader._46_2_;
  checkDynamicTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, Build) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  initDynamicTestMessage(root);
  checkTestMessage(root.asReader().as<TestAllTypes>());

  checkDynamicTestMessage(root.asReader());
  checkDynamicTestMessage(root);
}